

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O3

int anon_unknown.dwarf_263d3::ChannelOut_controlchange(lua_State *L)

{
  int iVar1;
  undefined8 in_RAX;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 uVar6;
  char cVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  plVar2 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar3 = luaL_checkinteger(L,2);
  iVar1 = lua_type(L,3);
  cVar7 = (char)uVar3;
  if (iVar1 == 1) {
    if (0x77 < uVar3) {
      luaL_argerror(L,2,"Controller number must be between 0 and 119");
    }
    lVar5 = plVar2[1];
    iVar1 = lua_toboolean(L,3);
    uStack_38._0_6_ = CONCAT15((char)lVar5 + -0x50,(undefined5)uStack_38);
    uStack_38._0_7_ = CONCAT16(cVar7,(undefined6)uStack_38);
    uVar6 = 0x7f;
    if (iVar1 == 0) {
      uVar6 = 0;
    }
    uStack_38 = CONCAT17(uVar6,(undefined7)uStack_38);
  }
  else {
    uVar4 = luaL_checkinteger(L,3);
    iVar1 = lua_isnumber(L,4);
    uVar6 = (undefined1)uVar4;
    if (iVar1 != 0) {
      uVar4 = luaL_checkinteger();
      if (0x1f < uVar3) {
        luaL_argerror(L,2,"Controller number must be between 0 and 31");
      }
      if (0x7f < uVar4) {
        luaL_argerror(L,4,"Controller value must be between 0 and 127");
      }
      uStack_38._0_6_ = CONCAT15((char)plVar2[1] + -0x50,(undefined5)uStack_38);
      uStack_38._0_7_ = CONCAT16(cVar7,(undefined6)uStack_38);
      uStack_38 = CONCAT17(uVar6,(undefined7)uStack_38);
      (**(code **)(**(long **)(*plVar2 + 8) + 0x58))(*(long **)(*plVar2 + 8),(long)&uStack_38 + 5,3)
      ;
      uStack_38._0_6_ = CONCAT15((char)plVar2[1] + -0x50,(undefined5)uStack_38);
      uStack_38._0_7_ = CONCAT16(cVar7 + ' ',(undefined6)uStack_38);
      uStack_38 = CONCAT17((char)uVar4,(undefined7)uStack_38);
LAB_0010b626:
      plVar2 = *(long **)(*plVar2 + 8);
      lVar5 = *plVar2;
      goto LAB_0010b73e;
    }
    iVar1 = lua_type(L,4);
    if (iVar1 == 1) {
      iVar1 = lua_toboolean(L,4);
      if (iVar1 != 0) {
        if (0x1f < uVar3) {
          luaL_argerror(L,2,"Controller number must be between 0 and 31");
        }
        if (0x3fff < uVar4) {
          luaL_argerror(L,3,"Controller value must be between 0 and 16383");
        }
        uStack_38._0_6_ = CONCAT15((char)plVar2[1] + -0x50,(undefined5)uStack_38);
        uStack_38._0_7_ = CONCAT16(cVar7,(undefined6)uStack_38);
        uStack_38 = CONCAT17((char)(uVar4 >> 7),(undefined7)uStack_38) & 0x7fffffffffffffff;
        (**(code **)(**(long **)(*plVar2 + 8) + 0x58))
                  (*(long **)(*plVar2 + 8),(long)&uStack_38 + 5,3);
        uStack_38._0_6_ = CONCAT15((char)plVar2[1] + -0x50,(undefined5)uStack_38);
        uStack_38._0_7_ = CONCAT16(cVar7 + ' ',(undefined6)uStack_38);
        uStack_38 = CONCAT17(uVar6,(undefined7)uStack_38) & 0x7fffffffffffffff;
        goto LAB_0010b626;
      }
    }
    if (0x77 < uVar3) {
      luaL_argerror(L,2,"Controller number must be between 0 and 119");
    }
    if (0x7f < uVar4) {
      luaL_argerror(L,3,"Controller value must be between 0 and 127");
    }
    uStack_38._0_6_ = CONCAT15((char)plVar2[1] + -0x50,(undefined5)uStack_38);
    uStack_38._0_7_ = CONCAT16(cVar7,(undefined6)uStack_38);
    uStack_38 = CONCAT17(uVar6,(undefined7)uStack_38);
  }
  plVar2 = *(long **)(*plVar2 + 8);
  lVar5 = *plVar2;
LAB_0010b73e:
  (**(code **)(lVar5 + 0x58))(plVar2,(long)&uStack_38 + 5,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_controlchange(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer cc = luaL_checkinteger(L, 2);

	if (lua_isboolean(L, 3)) {
		luaL_argcheck(L, cc >= 0 && cc <= 0x77, 2, "Controller number must be between 0 and 119");
		self.send(0xB0 + self.index, cc, lua_toboolean(L, 3) ? 0x7F : 0x00);
	}
	else {
		lua_Integer value = luaL_checkinteger(L, 3);
		if (lua_isnumber(L, 4)) {
			lua_Integer lsb = luaL_checkinteger(L, 4);
			luaL_argcheck(L, cc >= 0 && cc <= 0x1F, 2, "Controller number must be between 0 and 31");
			luaL_argcheck(L, lsb >= 0 && lsb <= 0x7F, 4, "Controller value must be between 0 and 127");
			self.send(0xB0 + self.index, cc, value);
			self.send(0xB0 + self.index, cc + 0x20, lsb);
		}
		else if (lua_isboolean(L, 4) && lua_toboolean(L, 4)) {
			luaL_argcheck(L, cc >= 0 && cc <= 0x1F, 2, "Controller number must be between 0 and 31");
			luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 3, "Controller value must be between 0 and 16383");
			self.send(0xB0 + self.index, cc, (value >> 7) & 0x7Fu);
			self.send(0xB0 + self.index, cc + 0x20, value & 0x7Fu);
		}
		else {
			luaL_argcheck(L, cc >= 0 && cc <= 0x77, 2, "Controller number must be between 0 and 119");
			luaL_argcheck(L, value >= 0 && value <= 0x7F, 3, "Controller value must be between 0 and 127");
			self.send(0xB0 + self.index, cc, value);
		}
	}

	lua_settop(L, 1);
	return 1;
}